

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O2

int htmlSaveFile(char *filename,xmlDocPtr cur)

{
  xmlParserErrors xVar1;
  int iVar2;
  xmlChar *encoding;
  xmlOutputBufferPtr buf;
  char *encoding_00;
  xmlCharEncodingHandlerPtr handler;
  
  handler = (xmlCharEncodingHandlerPtr)0x0;
  iVar2 = -1;
  if (filename != (char *)0x0 && cur != (xmlDocPtr)0x0) {
    xmlInitParser();
    encoding = htmlGetMetaEncoding(cur);
    xVar1 = htmlFindOutputEncoder((char *)encoding,&handler);
    if (xVar1 == XML_ERR_OK) {
      buf = xmlOutputBufferCreateFilename(filename,handler,cur->compression);
      if (buf != (xmlOutputBufferPtr)0x0) {
        htmlDocContentDumpOutput(buf,cur,encoding_00);
        iVar2 = xmlOutputBufferClose(buf);
      }
    }
  }
  return iVar2;
}

Assistant:

int
htmlSaveFile(const char *filename, xmlDocPtr cur) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    const char *encoding;
    int ret;

    if ((cur == NULL) || (filename == NULL))
        return(-1);

    xmlInitParser();

    encoding = (const char *) htmlGetMetaEncoding(cur);
    if (htmlFindOutputEncoder(encoding, &handler) != XML_ERR_OK)
        return(-1);
    buf = xmlOutputBufferCreateFilename(filename, handler, cur->compression);
    if (buf == NULL)
        return(-1);

    htmlDocContentDumpOutput(buf, cur, NULL);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}